

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# singly_linked_list.cpp
# Opt level: O2

SinglyNodeWithRand *
si9ma::SinglyLinkedList::common_loop_intersection
          (SinglyNodeWithRand *head1,SinglyNodeWithRand *head2,SinglyNodeWithRand *list_terminal)

{
  SinglyNodeWithRand *pSVar1;
  SinglyNodeWithRand *pSVar2;
  int iVar3;
  int iVar4;
  SinglyNodeWithRand *ptr;
  
  iVar3 = 0;
  for (pSVar2 = head1; pSVar1 = head2, pSVar2 != list_terminal; pSVar2 = pSVar2->next) {
    iVar3 = iVar3 + 1;
  }
  for (; pSVar1 != list_terminal; pSVar1 = pSVar1->next) {
    iVar3 = iVar3 + -1;
  }
  pSVar2 = head2;
  if (0 < iVar3) {
    pSVar2 = head1;
  }
  iVar4 = -iVar3;
  if (0 < iVar3) {
    iVar4 = iVar3;
  }
  for (; 0 < iVar4; iVar4 = iVar4 + -1) {
    pSVar2 = pSVar2->next;
  }
  if (0 < iVar3) {
    head1 = head2;
  }
  for (; pSVar2 != head1; pSVar2 = pSVar2->next) {
    head1 = head1->next;
  }
  return pSVar2;
}

Assistant:

SinglyNodeWithRand* SinglyLinkedList::common_loop_intersection(si9ma::SinglyNodeWithRand *head1, si9ma::SinglyNodeWithRand *head2, si9ma::SinglyNodeWithRand *list_terminal) {
        int len = 0;

        auto *ptr = head1;
        while (ptr != list_terminal){
            len ++;
            ptr = ptr->next;
        }

        ptr = head2;
        while (ptr != list_terminal){
            len --;
            ptr = ptr->next;
        }

        auto *long_list = len > 0 ? head1 : head2;
        auto *short_list = len > 0 ? head2 : head1;
        int diff = abs(len);

        while (diff-- > 0)
            long_list = long_list->next;

        while (long_list != short_list){
            long_list = long_list->next;
            short_list = short_list->next;
        }

        return long_list;
    }